

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

XMLError __thiscall tinyxml2::XMLDocument::SaveFile(XMLDocument *this,FILE *fp,bool compact)

{
  XMLError XVar1;
  XMLPrinter stream;
  XMLPrinter XStack_158;
  
  SetError(this,XML_SUCCESS,0,(char *)0x0);
  XMLPrinter::XMLPrinter(&XStack_158,fp,compact,0);
  (*(this->super_XMLNode)._vptr_XMLNode[0xe])(this,&XStack_158);
  XVar1 = this->_errorID;
  XMLPrinter::~XMLPrinter(&XStack_158);
  return XVar1;
}

Assistant:

XMLError XMLDocument::SaveFile( FILE* fp, bool compact )
{
    // Clear any error from the last save, otherwise it will get reported
    // for *this* call.
    ClearError();
    XMLPrinter stream( fp, compact );
    Print( &stream );
    return _errorID;
}